

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase68::run(TestCase68 *this)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Disposer *pDVar4;
  HttpHeaderTable *this_00;
  StringPtr *pSVar5;
  uint uVar6;
  HttpHeaderId *pHVar7;
  HttpHeaderId *extraout_RDX;
  HttpHeaderId *extraout_RDX_00;
  HttpHeaderId *extraout_RDX_01;
  HttpHeaderId *extraout_RDX_02;
  HttpHeaderId *extraout_RDX_03;
  HttpHeaderId *extraout_RDX_04;
  HttpHeaderId *extraout_RDX_05;
  HttpHeaderId *extraout_RDX_06;
  HttpHeaderId *extraout_RDX_07;
  HttpHeaderId *extraout_RDX_08;
  HttpHeaderId *extraout_RDX_09;
  HttpHeaderId *extraout_RDX_10;
  HttpHeaderId *extraout_RDX_11;
  HttpHeaderTable *ptrCopy_5;
  char *ptrCopy;
  bool bVar8;
  HttpHeaderId HVar9;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  Builder builder;
  undefined1 local_98 [24];
  Fault local_80;
  Builder local_78;
  HttpHeaderTable *local_68;
  uint local_60;
  HttpHeaderTable *local_58;
  uint local_50;
  HttpHeaderTable *local_48;
  uint local_40;
  HttpHeaderTable *local_38;
  uint local_30;
  
  HttpHeaderTable::Builder::Builder(&local_78);
  name_05.content.size_ = 5;
  name_05.content.ptr = "Host";
  HVar9 = HttpHeaderTable::Builder::add(&local_78,name_05);
  local_58 = HVar9.table;
  local_50 = HVar9.id;
  name_06.content.size_ = 5;
  name_06.content.ptr = "hOsT";
  HVar9 = HttpHeaderTable::Builder::add(&local_78,name_06);
  local_38 = HVar9.table;
  local_30 = HVar9.id;
  name_07.content.size_ = 8;
  name_07.content.ptr = "Foo-Bar";
  HVar9 = HttpHeaderTable::Builder::add(&local_78,name_07);
  local_68 = HVar9.table;
  local_60 = HVar9.id;
  name_08.content.size_ = 8;
  name_08.content.ptr = "baz-qux";
  HVar9 = HttpHeaderTable::Builder::add(&local_78,name_08);
  local_48 = HVar9.table;
  local_40 = HVar9.id;
  name_09.content.size_ = 8;
  name_09.content.ptr = "Baz-Qux";
  HVar9 = HttpHeaderTable::Builder::add(&local_78,name_09);
  this_00 = local_78.table.ptr;
  pDVar4 = local_78.table.disposer;
  local_78.table.ptr = (HttpHeaderTable *)0x0;
  if (((long)(this_00->namesById).builder.pos - (long)(this_00->namesById).builder.ptr &
      0xffffffff0U) != 0x110 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x54,ERROR,"\"failed: expected \" \"table->idCount() == builtinHeaderCount + 2\"",
               (char (*) [60])"failed: expected table->idCount() == builtinHeaderCount + 2");
  }
  if (_::Debug::minSeverity < 3 && local_50 != 0xb) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x56,ERROR,"\"failed: expected \" \"host == HttpHeaderId::HOST\"",
               (char (*) [44])"failed: expected host == HttpHeaderId::HOST");
  }
  if (_::Debug::minSeverity < 3 && local_50 == 0xc) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x57,ERROR,"\"failed: expected \" \"host != HttpHeaderId::DATE\"",
               (char (*) [44])"failed: expected host != HttpHeaderId::DATE");
  }
  if ((local_30 != local_50) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x58,ERROR,"\"failed: expected \" \"host2 == host\"",
               (char (*) [31])"failed: expected host2 == host");
  }
  if ((local_50 == local_60) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[32]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5a,ERROR,"\"failed: expected \" \"host != fooBar\"",
               (char (*) [32])"failed: expected host != fooBar");
  }
  pHVar7 = (HttpHeaderId *)(ulong)local_40;
  if ((local_50 == local_40) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[32]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5b,ERROR,"\"failed: expected \" \"host != bazQux\"",
               (char (*) [32])"failed: expected host != bazQux");
    pHVar7 = (HttpHeaderId *)(ulong)local_40;
  }
  if ((local_60 == (uint)pHVar7) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5c,ERROR,"\"failed: expected \" \"fooBar != bazQux\"",
               (char (*) [34])"failed: expected fooBar != bazQux");
    pHVar7 = (HttpHeaderId *)(ulong)local_40;
  }
  if (((uint)pHVar7 != HVar9.id) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5d,ERROR,"\"failed: expected \" \"bazQux == bazQux2\"",
               (char (*) [35])"failed: expected bazQux == bazQux2");
    pHVar7 = extraout_RDX;
  }
  str<kj::HttpHeaderId&>((String *)local_98,(kj *)&local_58,pHVar7);
  uVar3 = local_98._8_8_;
  uVar2 = local_98._0_8_;
  bVar8 = true;
  if ((HttpHeaderTable *)local_98._8_8_ == (HttpHeaderTable *)0x5) {
    bVar8 = *(uint *)local_98._0_8_ != 0x74736f48;
  }
  pHVar7 = extraout_RDX_00;
  if ((uint *)local_98._0_8_ != (uint *)0x0) {
    local_98._0_8_ = (uint *)0x0;
    local_98._8_8_ = (HttpHeaderTable *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_98._20_4_,local_98._16_4_))
              ((undefined8 *)CONCAT44(local_98._20_4_,local_98._16_4_),uVar2,1,uVar3,uVar3,0);
    pHVar7 = extraout_RDX_01;
  }
  if ((bool)(bVar8 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5f,ERROR,"\"failed: expected \" \"kj::str(host) == \\\"Host\\\"\"",
               (char (*) [41])"failed: expected kj::str(host) == \"Host\"");
    pHVar7 = extraout_RDX_02;
  }
  str<kj::HttpHeaderId&>((String *)local_98,(kj *)&local_38,pHVar7);
  uVar3 = local_98._8_8_;
  uVar2 = local_98._0_8_;
  bVar8 = true;
  if ((HttpHeaderTable *)local_98._8_8_ == (HttpHeaderTable *)0x5) {
    bVar8 = *(uint *)local_98._0_8_ != 0x74736f48;
  }
  pHVar7 = extraout_RDX_03;
  if ((uint *)local_98._0_8_ != (uint *)0x0) {
    local_98._0_8_ = (uint *)0x0;
    local_98._8_8_ = (HttpHeaderTable *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_98._20_4_,local_98._16_4_))
              ((undefined8 *)CONCAT44(local_98._20_4_,local_98._16_4_),uVar2,1,uVar3,uVar3,0);
    pHVar7 = extraout_RDX_04;
  }
  if ((bool)(bVar8 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x60,ERROR,"\"failed: expected \" \"kj::str(host2) == \\\"Host\\\"\"",
               (char (*) [42])"failed: expected kj::str(host2) == \"Host\"");
    pHVar7 = extraout_RDX_05;
  }
  str<kj::HttpHeaderId&>((String *)local_98,(kj *)&local_68,pHVar7);
  uVar3 = local_98._8_8_;
  uVar2 = local_98._0_8_;
  bVar8 = true;
  pHVar7 = extraout_RDX_06;
  if ((HttpHeaderTable *)local_98._8_8_ == (HttpHeaderTable *)&DAT_00000008) {
    uVar6 = *(uint *)(local_98._0_8_ + 3) ^ 0x7261422d | *(uint *)local_98._0_8_ ^ 0x2d6f6f46;
    pHVar7 = (HttpHeaderId *)(ulong)uVar6;
    bVar8 = uVar6 != 0;
  }
  if ((uint *)local_98._0_8_ != (uint *)0x0) {
    local_98._0_8_ = (uint *)0x0;
    local_98._8_8_ = (HttpHeaderTable *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_98._20_4_,local_98._16_4_))
              ((undefined8 *)CONCAT44(local_98._20_4_,local_98._16_4_),uVar2,1,uVar3,uVar3,0);
    pHVar7 = extraout_RDX_07;
  }
  if ((bool)(bVar8 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x61,ERROR,"\"failed: expected \" \"kj::str(fooBar) == \\\"Foo-Bar\\\"\"",
               (char (*) [46])"failed: expected kj::str(fooBar) == \"Foo-Bar\"");
    pHVar7 = extraout_RDX_08;
  }
  str<kj::HttpHeaderId&>((String *)local_98,(kj *)&local_48,pHVar7);
  uVar3 = local_98._8_8_;
  uVar2 = local_98._0_8_;
  bVar8 = true;
  pHVar7 = extraout_RDX_09;
  if ((HttpHeaderTable *)local_98._8_8_ == (HttpHeaderTable *)&DAT_00000008) {
    uVar6 = *(uint *)(local_98._0_8_ + 3) ^ 0x7875712d | *(uint *)local_98._0_8_ ^ 0x2d7a6162;
    pHVar7 = (HttpHeaderId *)(ulong)uVar6;
    bVar8 = uVar6 != 0;
  }
  if ((uint *)local_98._0_8_ != (uint *)0x0) {
    local_98._0_8_ = (uint *)0x0;
    local_98._8_8_ = (HttpHeaderTable *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_98._20_4_,local_98._16_4_))
              ((undefined8 *)CONCAT44(local_98._20_4_,local_98._16_4_),uVar2,1,uVar3,uVar3,0);
    pHVar7 = extraout_RDX_10;
  }
  if ((bool)(bVar8 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x62,ERROR,"\"failed: expected \" \"kj::str(bazQux) == \\\"baz-qux\\\"\"",
               (char (*) [46])"failed: expected kj::str(bazQux) == \"baz-qux\"");
    pHVar7 = extraout_RDX_11;
  }
  str<kj::HttpHeaderId_const&>((String *)local_98,(kj *)&HttpHeaderId::HOST,pHVar7);
  uVar3 = local_98._8_8_;
  uVar2 = local_98._0_8_;
  bVar8 = true;
  if ((HttpHeaderTable *)local_98._8_8_ == (HttpHeaderTable *)0x5) {
    bVar8 = *(uint *)local_98._0_8_ != 0x74736f48;
  }
  if ((uint *)local_98._0_8_ != (uint *)0x0) {
    local_98._0_8_ = (uint *)0x0;
    local_98._8_8_ = (HttpHeaderTable *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_98._20_4_,local_98._16_4_))
              ((undefined8 *)CONCAT44(local_98._20_4_,local_98._16_4_),uVar2,1,uVar3,uVar3,0);
  }
  if ((bool)(bVar8 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,99,ERROR,"\"failed: expected \" \"kj::str(HttpHeaderId::HOST) == \\\"Host\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpHeaderId::HOST) == \"Host\"");
  }
  pSVar5 = (this_00->namesById).builder.ptr;
  if (((pSVar5[0xc].content.size_ != 5) || (*(int *)pSVar5[0xc].content.ptr != 0x65746144)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"table->idToString(HttpHeaderId::DATE) == \\\"Date\\\"\"",
               (char (*) [65])"failed: expected table->idToString(HttpHeaderId::DATE) == \"Date\"");
    pSVar5 = (this_00->namesById).builder.ptr;
  }
  if (((pSVar5[local_60].content.size_ != 8) ||
      (piVar1 = (int *)pSVar5[local_60].content.ptr,
      *(int *)((long)piVar1 + 3) != 0x7261422d || *piVar1 != 0x2d6f6f46)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[56]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x66,ERROR,"\"failed: expected \" \"table->idToString(fooBar) == \\\"Foo-Bar\\\"\"",
               (char (*) [56])"failed: expected table->idToString(fooBar) == \"Foo-Bar\"");
  }
  name.content.size_ = 5;
  name.content.ptr = "Date";
  HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_98,this_00,name);
  if (local_98[0] == true) {
    if ((local_98._16_4_ != 0xc) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[84]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x68,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"Date\\\")) == HttpHeaderId::DATE\""
                 ,(char (*) [84])
                  "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"Date\")) == HttpHeaderId::DATE"
                );
    }
    name_00.content.size_ = 5;
    name_00.content.ptr = "dATE";
    HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_98,this_00,name_00);
    if (local_98[0] == true) {
      if ((local_98._16_4_ != 0xc) && (_::Debug::minSeverity < 3)) {
        _::Debug::log<char_const(&)[84]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x69,ERROR,
                   "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"dATE\\\")) == HttpHeaderId::DATE\""
                   ,(char (*) [84])
                    "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"dATE\")) == HttpHeaderId::DATE"
                  );
      }
      name_01.content.size_ = 8;
      name_01.content.ptr = "Foo-Bar";
      HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_98,this_00,name_01);
      if (local_98[0] == true) {
        if ((local_98._16_4_ != local_60) && (_::Debug::minSeverity < 3)) {
          _::Debug::log<char_const(&)[75]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                     ,0x6a,ERROR,
                     "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"Foo-Bar\\\")) == fooBar\""
                     ,(char (*) [75])
                      "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"Foo-Bar\")) == fooBar"
                    );
        }
        name_02.content.size_ = 8;
        name_02.content.ptr = "foo-BAR";
        HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_98,this_00,name_02);
        if (local_98[0] != true) {
          local_80.exception = (Exception *)0x0;
          local_98._0_8_ = (char *)0x0;
          local_98._8_8_ = (HttpHeaderTable *)0x0;
          _::Debug::Fault::init
                    (&local_80,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                    );
          _::Debug::Fault::fatal(&local_80);
        }
        if ((local_98._16_4_ != local_60) && (_::Debug::minSeverity < 3)) {
          _::Debug::log<char_const(&)[75]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                     ,0x6b,ERROR,
                     "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"foo-BAR\\\")) == fooBar\""
                     ,(char (*) [75])
                      "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"foo-BAR\")) == fooBar"
                    );
        }
        name_03.content.size_ = 7;
        name_03.content.ptr = "foobar";
        HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_98,this_00,name_03);
        if ((local_98[0] == true) && (_::Debug::minSeverity < 3)) {
          _::Debug::log<char_const(&)[56]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                     ,0x6c,ERROR,
                     "\"failed: expected \" \"table->stringToId(\\\"foobar\\\") == nullptr\"",
                     (char (*) [56])"failed: expected table->stringToId(\"foobar\") == nullptr");
        }
        name_04.content.size_ = 7;
        name_04.content.ptr = "barfoo";
        HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_98,this_00,name_04);
        if ((local_98[0] == true) && (_::Debug::minSeverity < 3)) {
          _::Debug::log<char_const(&)[56]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                     ,0x6d,ERROR,
                     "\"failed: expected \" \"table->stringToId(\\\"barfoo\\\") == nullptr\"",
                     (char (*) [56])"failed: expected table->stringToId(\"barfoo\") == nullptr");
        }
        (**pDVar4->_vptr_Disposer)(pDVar4,this_00);
        if (local_78.table.ptr != (HttpHeaderTable *)0x0) {
          local_78.table.ptr = (HttpHeaderTable *)0x0;
          (**(local_78.table.disposer)->_vptr_Disposer)();
        }
        return;
      }
      local_80.exception = (Exception *)0x0;
      local_98._0_8_ = (char *)0x0;
      local_98._8_8_ = (HttpHeaderTable *)0x0;
      _::Debug::Fault::init
                (&local_80,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                );
      _::Debug::Fault::fatal(&local_80);
    }
    local_80.exception = (Exception *)0x0;
    local_98._0_8_ = (char *)0x0;
    local_98._8_8_ = (HttpHeaderTable *)0x0;
    _::Debug::Fault::init
              (&local_80,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
              );
    _::Debug::Fault::fatal(&local_80);
  }
  local_80.exception = (Exception *)0x0;
  local_98._0_8_ = (char *)0x0;
  local_98._8_8_ = (HttpHeaderTable *)0x0;
  _::Debug::Fault::init
            (&local_80,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
            );
  _::Debug::Fault::fatal(&local_80);
}

Assistant:

TEST(AsyncUnixTest, Signals) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  kill(getpid(), SIGURG);

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_USER, info.si_code);
}